

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_encoding pugi::impl::anon_unknown_0::get_write_encoding(xml_encoding encoding)

{
  bool bVar1;
  undefined4 local_c;
  xml_encoding encoding_local;
  
  if (encoding == encoding_wchar) {
    local_c = get_wchar_encoding();
  }
  else if (encoding == encoding_utf16) {
    bVar1 = is_little_endian();
    local_c = encoding_utf16_be;
    if (bVar1) {
      local_c = encoding_utf16_le;
    }
  }
  else if (encoding == encoding_utf32) {
    bVar1 = is_little_endian();
    local_c = encoding_utf32_be;
    if (bVar1) {
      local_c = encoding_utf32_le;
    }
  }
  else {
    local_c = encoding;
    if (encoding == encoding_auto) {
      local_c = encoding_utf8;
    }
  }
  return local_c;
}

Assistant:

PUGI_IMPL_FN xml_encoding get_write_encoding(xml_encoding encoding)
	{
		// replace wchar encoding with utf implementation
		if (encoding == encoding_wchar) return get_wchar_encoding();

		// replace utf16 encoding with utf16 with specific endianness
		if (encoding == encoding_utf16) return is_little_endian() ? encoding_utf16_le : encoding_utf16_be;

		// replace utf32 encoding with utf32 with specific endianness
		if (encoding == encoding_utf32) return is_little_endian() ? encoding_utf32_le : encoding_utf32_be;

		// only do autodetection if no explicit encoding is requested
		if (encoding != encoding_auto) return encoding;

		// assume utf8 encoding
		return encoding_utf8;
	}